

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QTable.cpp
# Opt level: O2

void QTable::Save(QTables *Qs,string *filename)

{
  pointer pQVar1;
  pointer pQVar2;
  size_type sVar3;
  size_type sVar4;
  pointer pQVar5;
  size_type sVar6;
  long lVar7;
  ostream *poVar8;
  E *this;
  long lVar9;
  size_t a;
  size_type sVar10;
  ofstream fp;
  undefined8 auStack_3b0 [3];
  byte abStack_398 [480];
  stringstream ss;
  ostream local_1a8 [376];
  
  std::ofstream::ofstream(&fp,(filename->_M_dataplus)._M_p,_S_out);
  if ((abStack_398[*(long *)(_fp + -0x18)] & 5) == 0) {
    *(undefined8 *)((long)auStack_3b0 + *(long *)(_fp + -0x18)) = 0x10;
    pQVar1 = (Qs->super__Vector_base<QTable,_std::allocator<QTable>_>)._M_impl.
             super__Vector_impl_data._M_start;
    pQVar2 = (Qs->super__Vector_base<QTable,_std::allocator<QTable>_>)._M_impl.
             super__Vector_impl_data._M_finish;
    sVar3 = (pQVar1->super_matrix_t).size1_;
    sVar4 = (pQVar1->super_matrix_t).size2_;
    for (lVar7 = 0; lVar7 != ((long)pQVar2 - (long)pQVar1) / 0x30; lVar7 = lVar7 + 1) {
      lVar9 = 0;
      for (sVar6 = 0; sVar6 != sVar3; sVar6 = sVar6 + 1) {
        for (sVar10 = 0; sVar4 != sVar10; sVar10 = sVar10 + 1) {
          pQVar5 = (Qs->super__Vector_base<QTable,_std::allocator<QTable>_>)._M_impl.
                   super__Vector_impl_data._M_start;
          std::ostream::_M_insert<double>
                    (*(double *)
                      ((long)pQVar5[lVar7].super_matrix_t.data_.data_ +
                      sVar10 * 8 + pQVar5[lVar7].super_matrix_t.size2_ * lVar9));
          if (sVar4 - 1 != sVar10) {
            std::operator<<((ostream *)&fp," ");
          }
        }
        std::endl<char,std::char_traits<char>>((ostream *)&fp);
        lVar9 = lVar9 + 8;
      }
    }
    std::ofstream::~ofstream(&fp);
    return;
  }
  std::__cxx11::stringstream::stringstream((stringstream *)&ss);
  poVar8 = std::operator<<(local_1a8,"QTable::Save: failed to open file ");
  poVar8 = std::operator<<(poVar8,(string *)filename);
  std::endl<char,std::char_traits<char>>(poVar8);
  this = (E *)__cxa_allocate_exception(0x28);
  E::E(this,&ss);
  __cxa_throw(this,&E::typeinfo,E::~E);
}

Assistant:

void QTable::Save(const QTables &Qs, const std::string &filename)
{
    ofstream fp(filename.c_str());
    if(!fp)
    {
        stringstream ss;
        ss << "QTable::Save: failed to open file " << filename << endl;
        throw E(ss);
    }

    fp.precision(16);

    size_t nrRows=Qs[0].size1(),
        nrColumns=Qs[0].size2(),
        h=Qs.size();

    for(size_t k=0;k!=h;++k)
        for(size_t s=0;s!=nrRows;++s)
        {
            for(size_t a=0;a!=nrColumns;++a)
            {
                fp << Qs[k](s,a);
                if(a!=nrColumns-1)
                    fp << " ";
            }
            fp << endl;
        }
}